

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_Constructors_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_Constructors_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  int iVar2;
  Type type;
  int line;
  AssertHelper *this_00;
  key_equal kVar3;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  AssertionResult gtest_ar_1;
  TypeParam ht_iter_fourarg;
  TypeParam ht_iter_threearg;
  TypeParam ht_iter_twoarg;
  TypeParam ht_iter_onearg;
  TypeParam ht_iter_noarg;
  value_type *end;
  value_type *begin;
  int num_inputs;
  value_type input [4];
  int old_alloc_count;
  AssertionResult gtest_ar;
  TypeParam ht_fourarg;
  TypeParam ht_threearg;
  TypeParam ht_twoarg;
  TypeParam ht_onearg;
  TypeParam ht_noarg;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  int alloc_count;
  hasher hasher;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffee78;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  allocator_type *in_stack_ffffffffffffee80;
  undefined4 in_stack_ffffffffffffee88;
  undefined4 in_stack_ffffffffffffee8c;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffee90;
  undefined4 in_stack_ffffffffffffee98;
  int in_stack_ffffffffffffee9c;
  pair<const_int,_int> *in_stack_ffffffffffffeea0;
  undefined4 in_stack_ffffffffffffeea8;
  Type in_stack_ffffffffffffeeac;
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffeeb0;
  allocator_type *in_stack_ffffffffffffeec0;
  undefined4 in_stack_ffffffffffffeef8;
  undefined4 in_stack_ffffffffffffeefc;
  AssertHelper *in_stack_ffffffffffffef00;
  undefined4 in_stack_ffffffffffffefb8;
  undefined4 in_stack_ffffffffffffefbc;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffefc0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_eb0;
  int local_ea0;
  undefined4 local_e9c;
  AssertionResult local_e98 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e78;
  int local_e68;
  undefined4 local_e64;
  AssertionResult local_e60 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e40;
  Type local_e30;
  undefined4 local_e2c;
  AssertionResult local_e28 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e08;
  int local_df8;
  undefined4 local_df4;
  AssertionResult local_df0 [2];
  key_equal local_dd0;
  key_equal local_dc0;
  int local_db0;
  undefined4 local_dac;
  AssertionResult local_da8 [2];
  hasher local_d88;
  hasher local_d78;
  int local_d68;
  undefined4 local_d64;
  AssertionResult local_d60 [2];
  key_equal local_d40;
  key_equal local_d30;
  int local_d20;
  undefined4 local_d1c;
  AssertionResult local_d18 [2];
  hasher local_cf8;
  hasher local_ce8;
  int local_cd8;
  undefined4 local_cd4;
  AssertionResult local_cd0 [2];
  key_equal local_cb0;
  key_equal local_ca0;
  int local_c90;
  undefined4 local_c8c;
  AssertionResult local_c88 [2];
  hasher local_c68;
  hasher local_c58;
  int local_c48;
  undefined4 local_c44;
  AssertionResult local_c40 [2];
  key_equal local_c20;
  key_equal local_c10;
  int local_c00;
  undefined4 local_bfc;
  AssertionResult local_bf8 [2];
  hasher local_bd8;
  hasher local_bc8;
  int local_bb8;
  undefined4 local_bb4;
  AssertionResult local_bb0 [2];
  key_equal local_b90;
  key_equal local_b80;
  int local_b70;
  undefined4 local_b6c;
  AssertionResult local_b68 [2];
  hasher local_b48;
  hasher local_b38;
  int local_b28;
  undefined4 local_b24;
  AssertionResult local_b20 [2];
  key_equal local_b00;
  key_equal local_af0;
  int local_ae0;
  undefined4 local_adc;
  AssertionResult local_ad8 [2];
  hasher local_ab8;
  hasher local_aa8;
  int local_a98;
  undefined4 local_a94;
  AssertionResult local_a90 [2];
  key_equal local_a70;
  key_equal local_a60;
  int local_a50;
  undefined4 local_a4c;
  AssertionResult local_a48 [2];
  hasher local_a28;
  hasher local_a18;
  int local_a08;
  undefined4 local_a04;
  AssertionResult local_a00 [2];
  key_equal local_9e0;
  key_equal local_9d0;
  int local_9c0;
  undefined4 local_9bc;
  AssertionResult local_9b8 [2];
  hasher local_998;
  hasher local_988;
  int local_978;
  undefined4 local_974;
  AssertionResult local_970 [2];
  undefined4 local_94c;
  size_type local_948;
  AssertionResult local_940 [2];
  undefined4 local_91c;
  size_type local_918;
  AssertionResult local_910 [2];
  undefined4 local_8ec;
  size_type local_8e8;
  AssertionResult local_8e0 [2];
  undefined4 local_8bc;
  size_type local_8b8;
  AssertionResult local_8b0 [2];
  undefined4 local_88c;
  size_type local_888;
  AssertionResult local_880 [2];
  undefined4 local_85c;
  size_type local_858;
  AssertionResult local_850 [2];
  AssertionResult local_830 [6];
  value_type local_7c4;
  int local_7bc;
  AssertionResult local_7a8 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_700 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_658;
  Hasher local_644 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_5a0;
  Hasher local_590;
  Hasher local_584 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_4e0;
  Hasher local_4d0;
  Hasher local_4c4 [13];
  undefined1 *local_420;
  value_type *local_418;
  undefined4 local_40c;
  value_type local_408;
  value_type local_400;
  value_type local_3f8;
  value_type local_3f0;
  undefined1 auStack_3e8 [12];
  undefined4 local_3dc;
  undefined4 local_3c4;
  AssertionResult local_3c0 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_318 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_270;
  Hasher local_25c [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1b8;
  Hasher local_1a8;
  Hasher local_19c [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_f8;
  Hasher local_e8 [2];
  Hasher local_cc [13];
  undefined1 local_28 [40];
  
  Hasher::Hasher((Hasher *)(local_28 + 0x14),1);
  local_28._16_4_ = 0;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_28,2,
             (int *)(local_28 + 0x10));
  Hasher::Hasher(local_cc,0);
  Hasher::Hasher(local_e8,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_f8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffee80);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_f8);
  Hasher::Hasher(local_19c,0);
  Hasher::Hasher(&local_1a8,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_1b8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffee80);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_1b8);
  Hasher::Hasher(local_25c,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_270,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffee80);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_270);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_318,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffee80);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_318);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffee80);
  local_3c4 = 1;
  testing::internal::CmpHelperLE<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb132a9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb1330c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1337d);
  local_3dc = local_28._16_4_;
  local_408 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffee78,0);
  local_400 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffee78,0);
  local_3f8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffee78,0);
  local_3f0 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffee78,0);
  local_40c = 4;
  local_418 = &local_408;
  local_420 = auStack_3e8;
  Hasher::Hasher(local_4c4,0);
  Hasher::Hasher(&local_4d0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_4e0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashMap<std::pair<int_const,int>const*>
            (in_stack_ffffffffffffeeb0,
             (pair<const_int,_int> *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
             in_stack_ffffffffffffeea0,CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98)
             ,(hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_4e0);
  Hasher::Hasher(local_584,0);
  Hasher::Hasher(&local_590,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_5a0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashMap<std::pair<int_const,int>const*>
            (in_stack_ffffffffffffeeb0,
             (pair<const_int,_int> *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
             in_stack_ffffffffffffeea0,CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98)
             ,(hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_5a0);
  Hasher::Hasher(local_644,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_658,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashMap<std::pair<int_const,int>const*>
            (in_stack_ffffffffffffeeb0,
             (pair<const_int,_int> *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
             in_stack_ffffffffffffeea0,CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98)
             ,(hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_658);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_700,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashMap<std::pair<int_const,int>const*>
            (in_stack_ffffffffffffeeb0,
             (pair<const_int,_int> *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
             in_stack_ffffffffffffeea0,CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98)
             ,(hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_700);
  this_01 = (HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_28;
  google::
  HashtableInterface_SparseHashMap<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashMap<std::pair<int_const,int>const*>
            (in_stack_ffffffffffffeeb0,
             (pair<const_int,_int> *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
             in_stack_ffffffffffffeea0,CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98)
             ,(hasher *)in_stack_ffffffffffffee90,
             (key_equal *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             in_stack_ffffffffffffeec0);
  testing::internal::CmpHelperGT<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb138c2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb13925);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb13996);
  local_3dc = local_28._16_4_;
  for (local_7bc = 2; local_7bc < 2000; local_7bc = local_7bc + 1) {
    local_7c4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(this_01,0);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_ffffffffffffefc0,
             (value_type *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8));
  }
  testing::internal::CmpHelperGT<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_830);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb13a91);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb13af4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb13b65);
  local_858 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb13b72);
  local_85c = 100;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             (uint *)in_stack_ffffffffffffee80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_850);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb13c0a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb13c6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb13cde);
  local_888 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb13ceb);
  local_88c = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             (uint *)in_stack_ffffffffffffee80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_880);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb13d83);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb13de6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb13e57);
  local_8b8 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb13e64);
  local_8bc = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             (uint *)in_stack_ffffffffffffee80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb13efc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb13f5f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb13fd0);
  local_8e8 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb13fdd);
  local_8ec = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             (uint *)in_stack_ffffffffffffee80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb14075);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb140d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb14149);
  local_918 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb14156);
  local_91c = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             (uint *)in_stack_ffffffffffffee80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_910);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb141ee);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb14251);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb142c2);
  local_948 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb142cf);
  local_94c = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             (uint *)in_stack_ffffffffffffee80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_940);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb14367);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb143ca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1443b);
  local_974 = 0;
  local_998 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffee90);
  local_988 = local_998;
  local_978 = Hasher::id(&local_988);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_970);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb14537);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb1459a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1460b);
  local_9bc = 0;
  local_9e0 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffee90);
  local_9d0 = local_9e0;
  local_9c0 = Hasher::id(&local_9d0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb14707);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb1476a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb147db);
  local_a04 = 0;
  local_a28 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffee90);
  local_a18 = local_a28;
  local_a08 = Hasher::id(&local_a18);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb148d7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb1493a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb149ab);
  local_a4c = 0;
  local_a70 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffee90);
  local_a60 = local_a70;
  local_a50 = Hasher::id(&local_a60);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb14aa7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb14b0a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb14b7b);
  local_a94 = 1;
  local_ab8 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffee90);
  local_aa8 = local_ab8;
  local_a98 = Hasher::id(&local_aa8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb14c77);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb14cda);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb14d4b);
  local_adc = 0;
  local_b00 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffee90);
  local_af0 = local_b00;
  local_ae0 = Hasher::id(&local_af0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ad8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb14e47);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb14eaa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb14f1b);
  local_b24 = 1;
  local_b48 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffee90);
  local_b38 = local_b48;
  local_b28 = Hasher::id(&local_b38);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb15017);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb1507a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb150eb);
  local_b6c = 1;
  local_b90 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffee90);
  local_b80 = local_b90;
  local_b70 = Hasher::id(&local_b80);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb151e7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb1524a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb152bb);
  local_bb4 = 0;
  local_bd8 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffee90);
  local_bc8 = local_bd8;
  local_bb8 = Hasher::id(&local_bc8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_bb0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb153b7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb1541a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1548b);
  local_bfc = 0;
  local_c20 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffee90);
  local_c10 = local_c20;
  local_c00 = Hasher::id(&local_c10);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_bf8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb15587);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb155ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1565b);
  local_c44 = 0;
  local_c68 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffee90);
  local_c58 = local_c68;
  local_c48 = Hasher::id(&local_c58);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb15757);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb157ba);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1582b);
  local_c8c = 0;
  local_cb0 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffee90);
  local_ca0 = local_cb0;
  local_c90 = Hasher::id(&local_ca0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb15927);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb1598a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb159fb);
  local_cd4 = 1;
  local_cf8 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffee90);
  local_ce8 = local_cf8;
  local_cd8 = Hasher::id(&local_ce8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_cd0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb15af7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffef00,
               (Message *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb15b5a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb15bcb);
  local_d1c = 0;
  kVar3 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::key_eq(in_stack_ffffffffffffee90);
  local_d40 = kVar3;
  local_d30 = kVar3;
  iVar2 = Hasher::id(&local_d30);
  local_d20 = iVar2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb15cc7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (kVar3._0_8_,(Message *)CONCAT44(kVar3.num_compares_,iVar2));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb15d24);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb15d95);
  local_d64 = 1;
  local_d88 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffee90);
  local_d78 = local_d88;
  local_d68 = Hasher::id(&local_d78);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb15e7f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (kVar3._0_8_,(Message *)CONCAT44(kVar3.num_compares_,iVar2));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb15edc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb15f4d);
  local_dac = 1;
  local_dd0 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffee90);
  local_dc0 = local_dd0;
  local_db0 = Hasher::id(&local_dc0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_da8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb16037);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (kVar3._0_8_,(Message *)CONCAT44(kVar3.num_compares_,iVar2));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb16094);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb16105);
  local_df4 = 0;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)this_01);
  local_df8 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_e08);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_df0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    in_stack_ffffffffffffeeb0 =
         (HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xb161eb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
               (char *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,
               (char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (kVar3._0_8_,(Message *)CONCAT44(kVar3.num_compares_,iVar2));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb16248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb162b9);
  local_e2c = 0;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)this_01);
  type = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_e40);
  local_e30 = type;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98),
             (char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    in_stack_ffffffffffffeea0 =
         (pair<const_int,_int> *)
         testing::AssertionResult::failure_message((AssertionResult *)0xb1639f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,type,(char *)in_stack_ffffffffffffeea0,
               in_stack_ffffffffffffee9c,(char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (kVar3._0_8_,(Message *)CONCAT44(kVar3.num_compares_,iVar2));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb163fc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1646d);
  local_e64 = 2;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)this_01);
  line = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_e78);
  local_e68 = line;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(line,in_stack_ffffffffffffee98),(char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(in_stack_ffffffffffffee8c,in_stack_ffffffffffffee88),
             &in_stack_ffffffffffffee80->id_);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    in_stack_ffffffffffffee90 =
         (BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xb16553);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,type,(char *)in_stack_ffffffffffffeea0,line
               ,(char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (kVar3._0_8_,(Message *)CONCAT44(kVar3.num_compares_,iVar2));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee80);
    testing::Message::~Message((Message *)0xb165b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb16621);
  local_e9c = 2;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)this_01);
  local_ea0 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_eb0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(line,in_stack_ffffffffffffee98),(char *)in_stack_ffffffffffffee90,
             (int *)CONCAT44(local_ea0,in_stack_ffffffffffffee88),&in_stack_ffffffffffffee80->id_);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_eb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeeb0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb16707)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeeb0,type,(char *)in_stack_ffffffffffffeea0,line
               ,(char *)in_stack_ffffffffffffee90);
    testing::internal::AssertHelper::operator=
              (kVar3._0_8_,(Message *)CONCAT44(kVar3.num_compares_,iVar2));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xb16764);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb167d5);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb167e2);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb167ef);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb167fc);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb16809);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb16816);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb16823);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb16830);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1683d);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1684a);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb16857);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_28);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, Constructors) {
  // The key/value types don't matter here, so I just test on one set
  // of tables, the ones with int keys, which can easily handle the
  // placement-news we have to do below.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  int alloc_count = 0;
  Alloc<typename TypeParam::key_type> alloc(2, &alloc_count);

  TypeParam ht_noarg;
  TypeParam ht_onearg(100);
  TypeParam ht_twoarg(100, hasher);
  TypeParam ht_threearg(100, hasher, hasher);  // hasher serves as key_equal too
  TypeParam ht_fourarg(100, hasher, hasher, alloc);

  // The allocator should have been called at most once, for the last ht.
  EXPECT_LE(1, alloc_count);
  int old_alloc_count = alloc_count;

  const typename TypeParam::value_type input[] = {
      this->UniqueObject(1), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};
  const int num_inputs = sizeof(input) / sizeof(input[0]);
  const typename TypeParam::value_type* begin = &input[0];
  const typename TypeParam::value_type* end = begin + num_inputs;
  TypeParam ht_iter_noarg(begin, end);
  TypeParam ht_iter_onearg(begin, end, 100);
  TypeParam ht_iter_twoarg(begin, end, 100, hasher);
  TypeParam ht_iter_threearg(begin, end, 100, hasher, hasher);
  TypeParam ht_iter_fourarg(begin, end, 100, hasher, hasher, alloc);
  // Now the allocator should have been called more.
  EXPECT_GT(alloc_count, old_alloc_count);
  old_alloc_count = alloc_count;

  // Let's do a lot more inserting and make sure the alloc-count goes up
  for (int i = 2; i < 2000; i++) ht_fourarg.insert(this->UniqueObject(i));
  EXPECT_GT(alloc_count, old_alloc_count);

  EXPECT_LT(ht_noarg.bucket_count(), 100u);
  EXPECT_GE(ht_onearg.bucket_count(), 100u);
  EXPECT_GE(ht_twoarg.bucket_count(), 100u);
  EXPECT_GE(ht_threearg.bucket_count(), 100u);
  EXPECT_GE(ht_fourarg.bucket_count(), 100u);
  EXPECT_GE(ht_iter_onearg.bucket_count(), 100u);

  // When we pass in a hasher -- it can serve both as the hash-function
  // and the key-equal function -- its id should be 1.  Where we don't
  // pass it in and use the default Hasher object, the id should be 0.
  EXPECT_EQ(0, ht_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_noarg.key_eq().id());
  EXPECT_EQ(0, ht_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_onearg.key_eq().id());
  EXPECT_EQ(1, ht_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_threearg.key_eq().id());

  EXPECT_EQ(0, ht_iter_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_noarg.key_eq().id());
  EXPECT_EQ(0, ht_iter_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_onearg.key_eq().id());
  EXPECT_EQ(1, ht_iter_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_iter_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_iter_threearg.key_eq().id());

  // Likewise for the allocator
  EXPECT_EQ(0, ht_threearg.get_allocator().id());
  EXPECT_EQ(0, ht_iter_threearg.get_allocator().id());
  EXPECT_EQ(2, ht_fourarg.get_allocator().id());
  EXPECT_EQ(2, ht_iter_fourarg.get_allocator().id());
}